

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O3

void __thiscall ImDrawList::PopTextureID(ImDrawList *this)

{
  int iVar1;
  uint uVar2;
  void *pvVar3;
  
  iVar1 = (this->_TextureIdStack).Size;
  if (0 < iVar1) {
    uVar2 = iVar1 - 1;
    (this->_TextureIdStack).Size = uVar2;
    if (uVar2 == 0) {
      pvVar3 = (void *)0x0;
    }
    else {
      pvVar3 = (this->_TextureIdStack).Data[(ulong)uVar2 - 1];
    }
    (this->_CmdHeader).TextureId = pvVar3;
    _OnChangedTextureID(this);
    return;
  }
  __assert_fail("Size > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/inflex[P]OpenBoardView/src/imgui/imgui.h"
                ,0x65a,"void ImVector<void *>::pop_back() [T = void *]");
}

Assistant:

inline void         pop_back()                          { IM_ASSERT(Size > 0); Size--; }